

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueTest.hpp
# Opt level: O3

void Qentem::Test::TestGroupValue(QTest *test)

{
  ValueType VVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char *pcVar10;
  SizeT *pSVar11;
  SizeT SVar12;
  bool bVar13;
  Value<char> *pVVar14;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *arr;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *arr_00;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *arr_01;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  HVar22;
  ValueC value2;
  StringStream<char> ss;
  ValueC value;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_a8;
  char local_98;
  StringStream<char> local_88;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_78;
  char local_68;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  local_58;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_48;
  undefined1 local_38;
  
  paVar15 = &local_a8;
  arr = &local_a8;
  arr_00 = &local_a8;
  arr_01 = &local_a8;
  local_88.storage_ = (char *)0x0;
  local_88.length_ = 0;
  local_88.capacity_ = 0;
  local_78.array_.storage_ = (Value<char> *)0x0;
  local_78._8_8_ = 0;
  local_68 = 0;
  local_a8 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
  Value<char>::reset((Value<char> *)&local_78.array_);
  local_68 = '\x03';
  local_48.value_ = local_a8.value_;
  local_48._8_8_ = local_a8._8_8_;
  local_a8 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)(ZEXT816(0) << 0x20);
  local_38 = 2;
  Array<Qentem::Value<char>_>::operator+=(&local_78.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_a8.array_);
  local_a8 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
  if (local_68 == '\x03') {
    local_48.array_.storage_ = (Value<char> *)0x0;
    auVar16 = ZEXT816(0) << 0x40;
LAB_0012f030:
    local_a8 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
    local_48._8_8_ = vmovlps_avx(auVar16);
    local_38 = 2;
    Array<Qentem::Value<char>_>::operator+=(&local_78.array_,(Value<char> *)&local_48.array_);
    Value<char>::~Value((Value<char> *)&local_48.array_);
  }
  else {
    if (local_68 != '\x02') {
      Value<char>::reset((Value<char> *)&local_78.array_);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_a8._8_8_;
      local_68 = '\x03';
      local_48.number_ = local_a8.number_;
      goto LAB_0012f030;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_78.array_,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_);
  }
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_a8.array_);
  local_a8 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
  if (local_68 == '\x03') {
    local_48.array_.storage_ = (Value<char> *)0x0;
    auVar17 = ZEXT816(0) << 0x40;
LAB_0012f0b7:
    local_a8 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
    local_48._8_8_ = vmovlps_avx(auVar17);
    local_38 = 2;
    Array<Qentem::Value<char>_>::operator+=(&local_78.array_,(Value<char> *)&local_48.array_);
    Value<char>::~Value((Value<char> *)&local_48.array_);
  }
  else {
    if (local_68 != '\x02') {
      Value<char>::reset((Value<char> *)&local_78.array_);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_a8._8_8_;
      local_68 = '\x03';
      local_48.number_ = local_a8.number_;
      goto LAB_0012f0b7;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_78.array_,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_);
  }
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_a8.array_);
  local_a8 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
  if (local_68 == '\x03') {
    local_48.array_.storage_ = (Value<char> *)0x0;
    auVar18 = ZEXT816(0) << 0x40;
LAB_0012f13e:
    local_a8 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
    local_48._8_8_ = vmovlps_avx(auVar18);
    local_38 = 2;
    Array<Qentem::Value<char>_>::operator+=(&local_78.array_,(Value<char> *)&local_48.array_);
    Value<char>::~Value((Value<char> *)&local_48.array_);
  }
  else {
    if (local_68 != '\x02') {
      Value<char>::reset((Value<char> *)&local_78.array_);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_a8._8_8_;
      local_68 = '\x03';
      local_48.number_ = local_a8.number_;
      goto LAB_0012f13e;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_78.array_,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_);
  }
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_a8.array_);
  local_a8 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
  if (local_68 == '\x03') {
    local_48.array_.storage_ = (Value<char> *)0x0;
    auVar19 = ZEXT816(0) << 0x40;
LAB_0012f1c5:
    local_a8 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
    local_48._8_8_ = vmovlps_avx(auVar19);
    local_38 = 2;
    Array<Qentem::Value<char>_>::operator+=(&local_78.array_,(Value<char> *)&local_48.array_);
    Value<char>::~Value((Value<char> *)&local_48.array_);
  }
  else {
    if (local_68 != '\x02') {
      Value<char>::reset((Value<char> *)&local_78.array_);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_a8._8_8_;
      local_68 = '\x03';
      local_48.number_ = local_a8.number_;
      goto LAB_0012f1c5;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_78.array_,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_);
  }
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_a8.array_);
  local_a8 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
  if (local_68 == '\x03') {
    local_48.array_.storage_ = (Value<char> *)0x0;
    auVar20 = ZEXT816(0) << 0x40;
LAB_0012f24c:
    local_a8 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
    local_48._8_8_ = vmovlps_avx(auVar20);
    local_38 = 2;
    Array<Qentem::Value<char>_>::operator+=(&local_78.array_,(Value<char> *)&local_48.array_);
    Value<char>::~Value((Value<char> *)&local_48.array_);
  }
  else {
    if (local_68 != '\x02') {
      Value<char>::reset((Value<char> *)&local_78.array_);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_a8._8_8_;
      local_68 = '\x03';
      local_48.number_ = local_a8.number_;
      goto LAB_0012f24c;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_78.array_,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_);
  }
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_a8.array_);
  local_a8 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
  if (local_68 == '\x03') {
    local_48.array_.storage_ = (Value<char> *)0x0;
    auVar21 = ZEXT816(0) << 0x40;
LAB_0012f2d3:
    local_a8 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
    local_48._8_8_ = vmovlps_avx(auVar21);
    local_38 = 2;
    Array<Qentem::Value<char>_>::operator+=(&local_78.array_,(Value<char> *)&local_48.array_);
    Value<char>::~Value((Value<char> *)&local_48.array_);
  }
  else {
    if (local_68 != '\x02') {
      Value<char>::reset((Value<char> *)&local_78.array_);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_a8._8_8_;
      local_68 = '\x03';
      local_48.number_ = local_a8.number_;
      goto LAB_0012f2d3;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_78.array_,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_);
  }
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_a8.array_);
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,0);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"year",4);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x7e3;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,1);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"year",4);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x7e4;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,2);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"year",4);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x7e1;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,3);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"year",4);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x7e4;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,4);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"year",4);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x7e2;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,5);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"year",4);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x7e4;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,6);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"year",4);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x7e2;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,0);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"month",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x4;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,1);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"month",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x5;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,2);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"month",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x1;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,3);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"month",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x6;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,4);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"month",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x2;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,5);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"month",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x7;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,6);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"month",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x3;
  pVVar14->type_ = IntLong;
  local_98 = 0;
  local_a8 = (anon_union_16_5_5c8fea6c_for_Value<char>_1)ZEXT816(0);
  Value<char>::GroupBy((Value<char> *)&local_78.array_,(Value<char> *)&local_a8.array_,"year",4);
  Value<char>::Sort((Value<char> *)&local_a8.array_,true);
  while( true ) {
    VVar1 = ((Value<char> *)paVar15)->type_;
    if (VVar1 != ValuePtr) break;
    paVar15 = &((paVar15->array_).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[122]>
            (test,&local_88,
             (char (*) [122])
             "{\"2017\":[{\"month\":1}],\"2018\":[{\"month\":2},{\"month\":3}],\"2019\":[{\"month\":4}],\"2020\":[{\"month\":5},{\"month\":6},{\"month\":7}]}"
             ,0x1663);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  Value<char>::Sort((Value<char> *)&local_a8.array_,false);
  while( true ) {
    VVar1 = ((Value<char> *)arr)->type_;
    if (VVar1 != ValuePtr) break;
    arr = &((arr->array_).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&arr->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&arr->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[122]>
            (test,&local_88,
             (char (*) [122])
             "{\"2020\":[{\"month\":5},{\"month\":6},{\"month\":7}],\"2019\":[{\"month\":4}],\"2018\":[{\"month\":2},{\"month\":3}],\"2017\":[{\"month\":1}]}"
             ,0x166b);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_78.array_);
  local_68 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 0;
  Value<char>::GroupBy((Value<char> *)&local_78.array_,(Value<char> *)&local_a8.array_,"year",4);
  while( true ) {
    VVar1 = ((Value<char> *)arr_00)->type_;
    if (VVar1 != ValuePtr) break;
    arr_00 = &((arr_00->array_).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&arr_00->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&arr_00->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[1]>(test,&local_88,(char (*) [1])0x1403e1,0x1671);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,0);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"year1",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x7e3;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,1);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"year1",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x7e4;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,2);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"year1",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x7e1;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,3);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"year1",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x7e4;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,4);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"year1",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x7e2;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,5);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"year1",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x7e4;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,6);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"year1",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x7e2;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,0);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"month",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x4;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,1);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"month",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x5;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,2);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"month",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x1;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,3);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"month",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x6;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,4);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"month",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x2;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,5);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"month",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x7;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,6);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"month",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x3;
  pVVar14->type_ = IntLong;
  Value<char>::GroupBy((Value<char> *)&local_78.array_,(Value<char> *)&local_a8.array_,"year",4);
  while( true ) {
    VVar1 = ((Value<char> *)arr_01)->type_;
    if (VVar1 != ValuePtr) break;
    arr_01 = &((arr_01->array_).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&arr_01->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&arr_01->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[3]>(test,&local_88,(char (*) [3])"{}",0x1685);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_78.array_);
  local_68 = 0;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,0);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"year",4);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x7e3;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,1);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"year",4);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x7e4;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,2);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"year",4);
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,0);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"month",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x4;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,1);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"month",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x5;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,2);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"month",5);
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x1;
  pVVar14->type_ = IntLong;
  bVar13 = Value<char>::GroupBy
                     ((Value<char> *)&local_78.array_,(Value<char> *)&local_a8.array_,"year",4);
  QTest::IsFalse(test,bVar13,0x1693);
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,2);
  Value<char>::reset(pVVar14);
  pVVar14->type_ = Undefined;
  Value<char>::GroupBy((Value<char> *)&local_78.array_,(Value<char> *)&local_a8.array_,"year",4);
  bVar13 = Value<char>::GroupBy
                     ((Value<char> *)&local_78.array_,(Value<char> *)&local_a8.array_,"year",4);
  QTest::IsFalse(test,bVar13,0x1697);
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_48._8_8_ = 0;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,2);
  if (pVVar14->type_ != Object) {
    Value<char>::reset(pVVar14);
    pVVar14->type_ = Object;
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar14,"year",4);
  Value<char>::reset(pVVar14);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  operator=((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             *)pVVar14,
            (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             *)&local_48.array_);
  pVVar14->type_ = Object;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_48.array_);
  paVar15 = &local_78;
  bVar13 = Value<char>::GroupBy
                     ((Value<char> *)&paVar15->array_,(Value<char> *)&local_a8.array_,"year",4);
  QTest::IsFalse(test,bVar13,0x169a);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&paVar15->array_);
  local_68 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_48.number_ = (QNumber64)0x4;
  local_38 = 5;
  local_98 = '\x03';
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)0x1;
  local_38 = 5;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)0x3;
  local_38 = 5;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)0x5;
  local_38 = 5;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)0x2;
  local_38 = 5;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)0x7;
  local_38 = 5;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)0x6;
  local_38 = 5;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  Value<char>::reset((Value<char> *)&paVar15->array_);
  Value<char>::copyValue((Value<char> *)&paVar15->array_,(Value<char> *)&local_a8.array_);
  Value<char>::Sort((Value<char> *)&paVar15->array_,true);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[16]>
            (test,&local_88,(char (*) [16])"[1,2,3,4,5,6,7]",0x16ad);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  paVar15 = &local_78;
  Value<char>::reset((Value<char> *)&paVar15->array_);
  Value<char>::copyValue((Value<char> *)&paVar15->array_,(Value<char> *)&local_a8.array_);
  Value<char>::Sort((Value<char> *)&paVar15->array_,false);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[16]>
            (test,&local_88,(char (*) [16])"[7,6,5,4,3,2,1]",0x16b4);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  paVar15 = &local_78;
  Value<char>::reset((Value<char> *)&paVar15->array_);
  local_68 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = '\x03';
  local_48.array_.storage_ = (Value<char> *)0x401599999999999a;
  local_38 = 7;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  String<char>::String((String<char> *)&local_58,"str");
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)local_58.hashTable_;
  SVar12 = local_58.index_;
  local_58.index_ = 0;
  auVar2._8_8_ = 0;
  auVar2._0_4_ = local_58.index_;
  auVar2._4_4_ = local_58.capacity_;
  local_58 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )(auVar2 << 0x40);
  local_48.array_.index_ = SVar12;
  local_38 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  pSVar11 = local_58.hashTable_;
  if (local_58.hashTable_ != (SizeT *)0x0) {
    MemoryRecord::RemoveAllocation(local_58.hashTable_);
  }
  operator_delete(pSVar11);
  local_58 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )ZEXT816(0);
  if (local_98 == '\x03') {
LAB_001304bd:
    local_48.number_ = (QNumber64)local_58.hashTable_;
    SVar12 = local_58.capacity_;
    local_58 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                )ZEXT816(0);
    local_48._8_8_ = (ulong)SVar12 << 0x20;
    local_38 = 3;
    Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
    Value<char>::~Value((Value<char> *)&local_48.array_);
  }
  else {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
    if (local_58.index_ == 0) goto LAB_001304bd;
    Array<Qentem::Value<char>_>::operator+=
              (&local_a8.array_,(Array<Qentem::Value<char>_> *)&local_58);
  }
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&local_58);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_48._8_8_ = 0;
  local_38 = 10;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_48._8_8_ = 0;
  local_38 = 8;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  HVar22 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            )(ZEXT816(0) << 0x40);
  if (local_98 == '\x03') {
    local_48.array_.storage_ = (Value<char> *)0x0;
  }
  else {
    local_58 = HVar22;
    if (local_98 == '\x02') {
      HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
                ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_,
                 (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_58);
      goto LAB_001305fb;
    }
    Value<char>::reset((Value<char> *)&local_a8.array_);
    HVar22.index_ = 0;
    HVar22.capacity_ = 0;
    HVar22.hashTable_ = (SizeT *)local_58._8_8_;
    local_98 = '\x03';
    local_48.number_ = (QNumber64)local_58.hashTable_;
  }
  local_48._8_8_ = vmovlps_avx((undefined1  [16])HVar22);
  local_38 = 2;
  local_58 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )ZEXT816(0);
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
LAB_001305fb:
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable(&local_58);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_48._8_8_ = 0;
  local_38 = 9;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  Value<char>::reset((Value<char> *)&paVar15->array_);
  Value<char>::copyValue((Value<char> *)&paVar15->array_,(Value<char> *)&local_a8.array_);
  Value<char>::Sort((Value<char> *)&paVar15->array_,true);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,2);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,2);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[34]>
            (test,&local_88,(char (*) [34])"[{},[],\"str\",5.4,true,false,null]",0x16c7);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  paVar15 = &local_78;
  Value<char>::reset((Value<char> *)&paVar15->array_);
  Value<char>::copyValue((Value<char> *)&paVar15->array_,(Value<char> *)&local_a8.array_);
  Value<char>::Sort((Value<char> *)&paVar15->array_,false);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,2);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,2);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[34]>
            (test,&local_88,(char (*) [34])"[null,false,true,5.4,\"str\",[],{}]",0x16cd);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  paVar15 = &local_78;
  Value<char>::reset((Value<char> *)&paVar15->array_);
  local_68 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = '\x03';
  local_48.number_ = (QNumber64)0xfffffffffffffffc;
  local_38 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)0xffffffffffffffff;
  local_38 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)0xfffffffffffffffd;
  local_38 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)0xfffffffffffffffb;
  local_38 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)0xfffffffffffffffe;
  local_38 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)0xfffffffffffffff9;
  local_38 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)0xfffffffffffffffa;
  local_38 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  Value<char>::reset((Value<char> *)&paVar15->array_);
  Value<char>::copyValue((Value<char> *)&paVar15->array_,(Value<char> *)&local_a8.array_);
  Value<char>::Sort((Value<char> *)&paVar15->array_,true);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[23]>
            (test,&local_88,(char (*) [23])"[-7,-6,-5,-4,-3,-2,-1]",0x16e0);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  paVar15 = &local_78;
  Value<char>::reset((Value<char> *)&paVar15->array_);
  Value<char>::copyValue((Value<char> *)&paVar15->array_,(Value<char> *)&local_a8.array_);
  Value<char>::Sort((Value<char> *)&paVar15->array_,false);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[23]>
            (test,&local_88,(char (*) [23])"[-1,-2,-3,-4,-5,-6,-7]",0x16e7);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  paVar15 = &local_78;
  Value<char>::reset((Value<char> *)&paVar15->array_);
  local_68 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = '\x03';
  local_48.array_.storage_ = (Value<char> *)0x4012000000000000;
  local_38 = 7;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)0x3ff8000000000000;
  local_38 = 7;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)0x400c000000000000;
  local_38 = 7;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)0x4016000000000000;
  local_38 = 7;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)0x4004000000000000;
  local_38 = 7;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)&DAT_401e000000000000;
  local_38 = 7;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)0x401a000000000000;
  local_38 = 7;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  Value<char>::reset((Value<char> *)&paVar15->array_);
  Value<char>::copyValue((Value<char> *)&paVar15->array_,(Value<char> *)&local_a8.array_);
  Value<char>::Sort((Value<char> *)&paVar15->array_,true);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[30]>
            (test,&local_88,(char (*) [30])"[1.5,2.5,3.5,4.5,5.5,6.5,7.5]",0x16fa);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  paVar15 = &local_78;
  Value<char>::reset((Value<char> *)&paVar15->array_);
  Value<char>::copyValue((Value<char> *)&paVar15->array_,(Value<char> *)&local_a8.array_);
  Value<char>::Sort((Value<char> *)&paVar15->array_,false);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[30]>
            (test,&local_88,(char (*) [30])"[7.5,6.5,5.5,4.5,3.5,2.5,1.5]",0x1701);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  paVar15 = &local_78;
  Value<char>::reset((Value<char> *)&paVar15->array_);
  local_68 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = '\0';
  String<char>::String((String<char> *)&local_58,"b");
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)local_58.hashTable_;
  SVar12 = local_58.index_;
  local_58.index_ = 0;
  auVar3._8_8_ = 0;
  auVar3._0_4_ = local_58.index_;
  auVar3._4_4_ = local_58.capacity_;
  local_58 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )(auVar3 << 0x40);
  local_48.array_.index_ = SVar12;
  local_38 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  pSVar11 = local_58.hashTable_;
  if (local_58.hashTable_ != (SizeT *)0x0) {
    MemoryRecord::RemoveAllocation(local_58.hashTable_);
  }
  operator_delete(pSVar11);
  String<char>::String((String<char> *)&local_58,"a");
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)local_58.hashTable_;
  SVar12 = local_58.index_;
  local_58.index_ = 0;
  auVar4._8_8_ = 0;
  auVar4._0_4_ = local_58.index_;
  auVar4._4_4_ = local_58.capacity_;
  local_58 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )(auVar4 << 0x40);
  local_48.array_.index_ = SVar12;
  local_38 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  pSVar11 = local_58.hashTable_;
  if (local_58.hashTable_ != (SizeT *)0x0) {
    MemoryRecord::RemoveAllocation(local_58.hashTable_);
  }
  operator_delete(pSVar11);
  String<char>::String((String<char> *)&local_58,"g");
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)local_58.hashTable_;
  SVar12 = local_58.index_;
  local_58.index_ = 0;
  auVar5._8_8_ = 0;
  auVar5._0_4_ = local_58.index_;
  auVar5._4_4_ = local_58.capacity_;
  local_58 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )(auVar5 << 0x40);
  local_48.array_.index_ = SVar12;
  local_38 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  pSVar11 = local_58.hashTable_;
  if (local_58.hashTable_ != (SizeT *)0x0) {
    MemoryRecord::RemoveAllocation(local_58.hashTable_);
  }
  operator_delete(pSVar11);
  String<char>::String((String<char> *)&local_58,"f");
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)local_58.hashTable_;
  SVar12 = local_58.index_;
  local_58.index_ = 0;
  auVar6._8_8_ = 0;
  auVar6._0_4_ = local_58.index_;
  auVar6._4_4_ = local_58.capacity_;
  local_58 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )(auVar6 << 0x40);
  local_48.array_.index_ = SVar12;
  local_38 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  pSVar11 = local_58.hashTable_;
  if (local_58.hashTable_ != (SizeT *)0x0) {
    MemoryRecord::RemoveAllocation(local_58.hashTable_);
  }
  operator_delete(pSVar11);
  String<char>::String((String<char> *)&local_58,"c");
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)local_58.hashTable_;
  SVar12 = local_58.index_;
  local_58.index_ = 0;
  auVar7._8_8_ = 0;
  auVar7._0_4_ = local_58.index_;
  auVar7._4_4_ = local_58.capacity_;
  local_58 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )(auVar7 << 0x40);
  local_48.array_.index_ = SVar12;
  local_38 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  pSVar11 = local_58.hashTable_;
  if (local_58.hashTable_ != (SizeT *)0x0) {
    MemoryRecord::RemoveAllocation(local_58.hashTable_);
  }
  operator_delete(pSVar11);
  String<char>::String((String<char> *)&local_58,"e");
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)local_58.hashTable_;
  SVar12 = local_58.index_;
  local_58.index_ = 0;
  auVar8._8_8_ = 0;
  auVar8._0_4_ = local_58.index_;
  auVar8._4_4_ = local_58.capacity_;
  local_58 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )(auVar8 << 0x40);
  local_48.array_.index_ = SVar12;
  local_38 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  pSVar11 = local_58.hashTable_;
  if (local_58.hashTable_ != (SizeT *)0x0) {
    MemoryRecord::RemoveAllocation(local_58.hashTable_);
  }
  operator_delete(pSVar11);
  String<char>::String((String<char> *)&local_58,"d");
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.number_ = (QNumber64)local_58.hashTable_;
  SVar12 = local_58.index_;
  local_58.index_ = 0;
  auVar9._8_8_ = 0;
  auVar9._0_4_ = local_58.index_;
  auVar9._4_4_ = local_58.capacity_;
  local_58 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )(auVar9 << 0x40);
  local_48.array_.index_ = SVar12;
  local_38 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  pSVar11 = local_58.hashTable_;
  if (local_58.hashTable_ != (SizeT *)0x0) {
    MemoryRecord::RemoveAllocation(local_58.hashTable_);
  }
  operator_delete(pSVar11);
  Value<char>::reset((Value<char> *)&paVar15->array_);
  Value<char>::copyValue((Value<char> *)&paVar15->array_,(Value<char> *)&local_a8.array_);
  Value<char>::Sort((Value<char> *)&paVar15->array_,true);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[30]>
            (test,&local_88,(char (*) [30])"[\"a\",\"b\",\"c\",\"d\",\"e\",\"f\",\"g\"]",0x1713);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  paVar15 = &local_78;
  Value<char>::reset((Value<char> *)&paVar15->array_);
  Value<char>::copyValue((Value<char> *)&paVar15->array_,(Value<char> *)&local_a8.array_);
  Value<char>::Sort((Value<char> *)&paVar15->array_,false);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[30]>
            (test,&local_88,(char (*) [30])"[\"g\",\"f\",\"e\",\"d\",\"c\",\"b\",\"a\"]",0x171a);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_78.array_);
  local_68 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = '\x03';
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_38 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_38 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_38 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,0);
  if (&pVVar14->field_0 != &local_a8) {
    Value<char>::reset(pVVar14);
    Value<char>::copyValue(pVVar14,(Value<char> *)&local_a8.array_);
  }
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_38 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_38 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  paVar15 = &local_78;
  pVVar14 = Value<char>::operator[]((Value<char> *)&paVar15->array_,1);
  if (&pVVar14->field_0 != &local_a8) {
    Value<char>::reset(pVVar14);
    Value<char>::copyValue(pVVar14,(Value<char> *)&local_a8.array_);
  }
  Value<char>::Sort((Value<char> *)&paVar15->array_,true);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[22]>
            (test,&local_88,(char (*) [22])"[[0,0,0],[0,0,0,0,0]]",0x172d);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_78.array_);
  local_68 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = '\x03';
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_38 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_38 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_38 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,0);
  if (&pVVar14->field_0 != &local_a8) {
    Value<char>::reset(pVVar14);
    Value<char>::copyValue(pVVar14,(Value<char> *)&local_a8.array_);
  }
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_38 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_38 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  paVar15 = &local_78;
  pVVar14 = Value<char>::operator[]((Value<char> *)&paVar15->array_,1);
  if (&pVVar14->field_0 != &local_a8) {
    Value<char>::reset(pVVar14);
    Value<char>::copyValue(pVVar14,(Value<char> *)&local_a8.array_);
  }
  Value<char>::Sort((Value<char> *)&paVar15->array_,false);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[22]>
            (test,&local_88,(char (*) [22])"[[0,0,0,0,0],[0,0,0]]",0x173e);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_78.array_);
  local_68 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = '\x02';
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_,"a",1)
  ;
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar14->type_ = IntLong;
  if (local_98 != '\x02') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x02';
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_,"b",1)
  ;
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar14->type_ = IntLong;
  if (local_98 != '\x02') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x02';
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_,"c",1)
  ;
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,0);
  if (&pVVar14->field_0 != &local_a8) {
    Value<char>::reset(pVVar14);
    Value<char>::copyValue(pVVar14,(Value<char> *)&local_a8.array_);
  }
  if (local_98 != '\x02') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x02';
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_,"d",1)
  ;
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar14->type_ = IntLong;
  if (local_98 != '\x02') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x02';
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_,"e",1)
  ;
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar14->type_ = IntLong;
  paVar15 = &local_78;
  pVVar14 = Value<char>::operator[]((Value<char> *)&paVar15->array_,1);
  if (&pVVar14->field_0 != &local_a8) {
    Value<char>::reset(pVVar14);
    Value<char>::copyValue(pVVar14,(Value<char> *)&local_a8.array_);
  }
  Value<char>::Sort((Value<char> *)&paVar15->array_,true);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[54]>
            (test,&local_88,
             (char (*) [54])"[{\"a\":0,\"b\":0,\"c\":0},{\"a\":0,\"b\":0,\"c\":0,\"d\":0,\"e\":0}]",
             0x1751);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_78.array_);
  local_68 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = '\x02';
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_,"a",1)
  ;
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar14->type_ = IntLong;
  if (local_98 != '\x02') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x02';
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_,"b",1)
  ;
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar14->type_ = IntLong;
  if (local_98 != '\x02') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x02';
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_,"c",1)
  ;
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar14->type_ = IntLong;
  pVVar14 = Value<char>::operator[]((Value<char> *)&local_78.array_,0);
  if (&pVVar14->field_0 != &local_a8) {
    Value<char>::reset(pVVar14);
    Value<char>::copyValue(pVVar14,(Value<char> *)&local_a8.array_);
  }
  if (local_98 != '\x02') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x02';
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_,"d",1)
  ;
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar14->type_ = IntLong;
  if (local_98 != '\x02') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x02';
  }
  pVVar14 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_,"e",1)
  ;
  Value<char>::reset(pVVar14);
  (pVVar14->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar14->type_ = IntLong;
  paVar15 = &local_78;
  pVVar14 = Value<char>::operator[]((Value<char> *)&paVar15->array_,1);
  if (&pVVar14->field_0 != &local_a8) {
    Value<char>::reset(pVVar14);
    Value<char>::copyValue(pVVar14,(Value<char> *)&local_a8.array_);
  }
  Value<char>::Sort((Value<char> *)&paVar15->array_,false);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[54]>
            (test,&local_88,
             (char (*) [54])"[{\"a\":0,\"b\":0,\"c\":0,\"d\":0,\"e\":0},{\"a\":0,\"b\":0,\"c\":0}]",
             0x1762);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  paVar15 = &local_78;
  Value<char>::reset((Value<char> *)&paVar15->array_);
  local_68 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = '\x03';
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_48._8_8_ = 0;
  local_38 = 8;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_48._8_8_ = 0;
  local_38 = 8;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  Value<char>::reset((Value<char> *)&paVar15->array_);
  Value<char>::copyValue((Value<char> *)&paVar15->array_,(Value<char> *)&local_a8.array_);
  Value<char>::Sort((Value<char> *)&paVar15->array_,true);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (test,&local_88,(char (*) [12])"[true,true]",0x1772);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  paVar15 = &local_78;
  Value<char>::reset((Value<char> *)&paVar15->array_);
  Value<char>::copyValue((Value<char> *)&paVar15->array_,(Value<char> *)&local_a8.array_);
  Value<char>::Sort((Value<char> *)&paVar15->array_,false);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (test,&local_88,(char (*) [12])"[true,true]",0x1779);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  paVar15 = &local_78;
  Value<char>::reset((Value<char> *)&paVar15->array_);
  local_68 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = '\x03';
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_48._8_8_ = 0;
  local_38 = 9;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_48._8_8_ = 0;
  local_38 = 9;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  Value<char>::reset((Value<char> *)&paVar15->array_);
  Value<char>::copyValue((Value<char> *)&paVar15->array_,(Value<char> *)&local_a8.array_);
  Value<char>::Sort((Value<char> *)&paVar15->array_,true);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (test,&local_88,(char (*) [14])"[false,false]",0x1787);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  paVar15 = &local_78;
  Value<char>::reset((Value<char> *)&paVar15->array_);
  Value<char>::copyValue((Value<char> *)&paVar15->array_,(Value<char> *)&local_a8.array_);
  Value<char>::Sort((Value<char> *)&paVar15->array_,false);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (test,&local_88,(char (*) [14])"[false,false]",0x178e);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  paVar15 = &local_78;
  Value<char>::reset((Value<char> *)&paVar15->array_);
  local_68 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = '\x03';
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_48._8_8_ = 0;
  local_38 = 10;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_48.array_.storage_ = (Value<char> *)0x0;
  local_48._8_8_ = 0;
  local_38 = 10;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_48.array_);
  Value<char>::~Value((Value<char> *)&local_48.array_);
  Value<char>::reset((Value<char> *)&paVar15->array_);
  Value<char>::copyValue((Value<char> *)&paVar15->array_,(Value<char> *)&local_a8.array_);
  Value<char>::Sort((Value<char> *)&paVar15->array_,true);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (test,&local_88,(char (*) [12])"[null,null]",0x179b);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  paVar15 = &local_78;
  Value<char>::reset((Value<char> *)&paVar15->array_);
  Value<char>::copyValue((Value<char> *)&paVar15->array_,(Value<char> *)&local_a8.array_);
  Value<char>::Sort((Value<char> *)&paVar15->array_,false);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (test,&local_88,(char (*) [12])"[null,null]",0x17a2);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  paVar15 = &local_78;
  Value<char>::RemoveIndex((Value<char> *)&paVar15->array_,0);
  Value<char>::RemoveIndex((Value<char> *)&paVar15->array_,1);
  Value<char>::Sort((Value<char> *)&paVar15->array_,true);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[3]>(test,&local_88,(char (*) [3])"[]",0x17aa);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  paVar15 = &local_78;
  Value<char>::Sort((Value<char> *)&paVar15->array_,false);
  while( true ) {
    VVar1 = *(ValueType *)(paVar15 + 1);
    if (VVar1 != ValuePtr) break;
    paVar15 = &((((anon_union_16_5_5c8fea6c_for_Value<char>_1 *)&(paVar15->array_).storage_)->array_
                ).storage_)->field_0;
  }
  if (VVar1 == Array) {
    Value<char>::stringifyArray<Qentem::StringStream<char>>(&paVar15->array_,&local_88,0xf);
  }
  else if (VVar1 == Object) {
    Value<char>::stringifyObject<Qentem::StringStream<char>>(&paVar15->object_,&local_88,0xf);
  }
  QTest::IsEqual<Qentem::StringStream<char>,char[3]>(test,&local_88,(char (*) [3])"[]",0x17af);
  Value<char>::~Value((Value<char> *)&local_a8.array_);
  Value<char>::~Value((Value<char> *)&local_78.array_);
  pcVar10 = local_88.storage_;
  if (local_88.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_88.storage_);
  }
  operator_delete(pcVar10);
  return;
}

Assistant:

static void TestGroupValue(QTest &test) {
    StringStream<char> ss;
    ValueC             value;

    value += VHArray{};
    value += VHArray{};
    value += VHArray{};
    value += VHArray{};
    value += VHArray{};
    value += VHArray{};
    value += VHArray{};

    value[0]["year"] = 2019;
    value[1]["year"] = 2020;
    value[2]["year"] = 2017;
    value[3]["year"] = 2020;
    value[4]["year"] = 2018;
    value[5]["year"] = 2020;
    value[6]["year"] = 2018;

    value[0]["month"] = 4;
    value[1]["month"] = 5;
    value[2]["month"] = 1;
    value[3]["month"] = 6;
    value[4]["month"] = 2;
    value[5]["month"] = 7;
    value[6]["month"] = 3;

    ValueC value2;
    value.GroupBy(value2, "year");
    value2.Sort();

    test.IsEqual(
        value2.Stringify(ss),
        R"({"2017":[{"month":1}],"2018":[{"month":2},{"month":3}],"2019":[{"month":4}],"2020":[{"month":5},{"month":6},{"month":7}]})",
        __LINE__);
    ss.Clear();

    value2.Sort(false);

    test.IsEqual(
        value2.Stringify(ss),
        R"({"2020":[{"month":5},{"month":6},{"month":7}],"2019":[{"month":4}],"2018":[{"month":2},{"month":3}],"2017":[{"month":1}]})",
        __LINE__);
    ss.Clear();

    value.Reset();
    value2.Reset();
    value.GroupBy(value2, "year");
    test.IsEqual(value2.Stringify(ss), R"()", __LINE__);
    ss.Clear();

    value[0]["year1"] = 2019;
    value[1]["year1"] = 2020;
    value[2]["year1"] = 2017;
    value[3]["year1"] = 2020;
    value[4]["year1"] = 2018;
    value[5]["year1"] = 2020;
    value[6]["year1"] = 2018;

    value[0]["month"] = 4;
    value[1]["month"] = 5;
    value[2]["month"] = 1;
    value[3]["month"] = 6;
    value[4]["month"] = 2;
    value[5]["month"] = 7;
    value[6]["month"] = 3;

    value.GroupBy(value2, "year");
    test.IsEqual(value2.Stringify(ss), R"({})", __LINE__);
    ss.Clear();
    ////

    value.Reset();

    value[0]["year"] = 2019;
    value[1]["year"] = 2020;
    value[2]["year"];

    value[0]["month"] = 4;
    value[1]["month"] = 5;
    value[2]["month"] = 1;

    test.IsFalse(value.GroupBy(value2, "year"), __LINE__);

    value[2].Reset();
    value.GroupBy(value2, "year");
    test.IsFalse(value.GroupBy(value2, "year"), __LINE__);

    value[2]["year"] = VHArray{};
    test.IsFalse(value.GroupBy(value2, "year"), __LINE__);

    ///////////////////
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2 += unsigned{4};
    value2 += unsigned{1};
    value2 += unsigned{3};
    value2 += unsigned{5};
    value2 += unsigned{2};
    value2 += unsigned{7};
    value2 += unsigned{6};

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([1,2,3,4,5,6,7])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([7,6,5,4,3,2,1])", __LINE__);
    ss.Clear();

    //////////////////////

    value.Reset();
    value2.Reset();

    value2 += 5.4;
    value2 += "str";
    value2 += VArray{};
    value2 += nullptr;
    value2 += true;
    value2 += VHArray{};
    value2 += false;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss, 2U), R"([{},[],"str",5.4,true,false,null])", __LINE__);
    ss.Clear();

    value = value2;
    value.Sort(false);

    test.IsEqual(value.Stringify(ss, 2U), R"([null,false,true,5.4,"str",[],{}])", __LINE__);
    ss.Clear();

    ///////////////////

    value.Reset();
    value2.Reset();

    value2 += -4;
    value2 += -1;
    value2 += -3;
    value2 += -5;
    value2 += -2;
    value2 += -7;
    value2 += -6;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([-7,-6,-5,-4,-3,-2,-1])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([-1,-2,-3,-4,-5,-6,-7])", __LINE__);
    ss.Clear();

    ///////////////////

    value.Reset();
    value2.Reset();

    value2 += 4.5;
    value2 += 1.5;
    value2 += 3.5;
    value2 += 5.5;
    value2 += 2.5;
    value2 += 7.5;
    value2 += 6.5;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([1.5,2.5,3.5,4.5,5.5,6.5,7.5])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([7.5,6.5,5.5,4.5,3.5,2.5,1.5])", __LINE__);
    ss.Clear();

    ///////////////////
    value.Reset();
    value2.Reset();

    value2 += "b";
    value2 += "a";
    value2 += "g";
    value2 += "f";
    value2 += "c";
    value2 += "e";
    value2 += "d";

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"(["a","b","c","d","e","f","g"])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"(["g","f","e","d","c","b","a"])", __LINE__);
    ss.Clear();

    ///////////////////

    value.Reset();
    value2.Reset();

    value2 += 0;
    value2 += 0;
    value2 += 0;
    value[0] = value2;

    value2 += 0;
    value2 += 0;
    value[1] = value2;

    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([[0,0,0],[0,0,0,0,0]])", __LINE__);
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2 += 0;
    value2 += 0;
    value2 += 0;
    value[0] = value2;

    value2 += 0;
    value2 += 0;
    value[1] = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([[0,0,0,0,0],[0,0,0]])", __LINE__);

    ///////////////////
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2["a"] = 0;
    value2["b"] = 0;
    value2["c"] = 0;
    value[0]    = value2;

    value2["d"] = 0;
    value2["e"] = 0;
    value[1]    = value2;

    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([{"a":0,"b":0,"c":0},{"a":0,"b":0,"c":0,"d":0,"e":0}])", __LINE__);
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2["a"] = 0;
    value2["b"] = 0;
    value2["c"] = 0;
    value[0]    = value2;

    value2["d"] = 0;
    value2["e"] = 0;
    value[1]    = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([{"a":0,"b":0,"c":0,"d":0,"e":0},{"a":0,"b":0,"c":0}])", __LINE__);

    //////////////////////

    ///////////////////
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2 += true;
    value2 += true;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([true,true])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([true,true])", __LINE__);
    ss.Clear();

    //////////

    value.Reset();
    value2.Reset();

    value2 += false;
    value2 += false;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([false,false])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([false,false])", __LINE__);
    ///////////
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2 += nullptr;
    value2 += nullptr;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([null,null])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([null,null])", __LINE__);
    ss.Clear();
    ///////////
    value.RemoveIndex(0);
    value.RemoveIndex(1);

    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([])", __LINE__);
    ss.Clear();

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([])", __LINE__);
    ///////////////////
}